

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O2

int node::
    index_tree_recursion<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
              (TreeIndexAll *ti,Node<label::StringLabel> *n,LabelDictionary<label::StringLabel> *ld,
              UnitCostModelLD<label::StringLabel> *cm,int *start_preorder,int *start_postorder,
              int start_depth,int *subtree_max_depth,int start_height,int *height,
              int parent_preorder,bool is_rightmost_child)

{
  uint uVar1;
  Node<label::StringLabel> *pNVar2;
  pointer pNVar3;
  pointer pNVar4;
  pointer plVar5;
  pointer pdVar6;
  pointer pdVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int *child_id;
  pointer piVar12;
  mapped_type *this;
  reference this_00;
  pointer piVar13;
  long lVar14;
  int iVar15;
  Node<label::StringLabel> *n_00;
  long lVar16;
  long lVar17;
  long lVar18;
  pointer plVar19;
  pointer plVar20;
  int iVar21;
  bool is_rightmost_child_00;
  reference rVar22;
  int this_subtree_max_depth;
  int local_134;
  int local_130;
  int subtree_size_child;
  ulong local_128;
  int *local_120;
  long local_118;
  ulong local_110;
  int local_108;
  int label_id;
  ulong local_100;
  vector<int,_std::allocator<int>_> children_subtree_deletion_costs;
  long local_e0;
  int local_cc;
  vector<int,_std::allocator<int>_> children_sorted_subtree_size;
  vector<int,_std::allocator<int>_> children_preorders;
  vector<int,_std::allocator<int>_> children_postorders;
  
  iVar9 = label::LabelDictionary<label::StringLabel>::insert(ld,&n->label_);
  uVar1 = *start_preorder;
  local_128 = (ulong)uVar1;
  *start_preorder = uVar1 + 1;
  children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  label_id = iVar9;
  if ((int)(((long)(ti->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(ti->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= start_depth) {
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&ti->super_InvertedListDepthToPostL,&children_subtree_deletion_costs);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>);
  }
  local_118 = (long)(int)uVar1;
  this_subtree_max_depth = 0;
  subtree_size_child = -1;
  pNVar2 = (n->children_).
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar21 = -1;
  local_e0 = 0;
  local_100 = 0;
  is_rightmost_child_00 = false;
  local_134 = -1;
  iVar11 = -1;
  local_110 = 0;
  n_00 = (n->children_).
         super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_130 = local_134;
  local_120 = start_postorder;
  local_108 = local_134;
  while (n_00 != pNVar2) {
    std::vector<int,_std::allocator<int>_>::push_back(&children_preorders,start_preorder);
    is_rightmost_child_00 = (bool)(is_rightmost_child_00 | n_00 + 1 == pNVar2);
    (ti->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[*start_preorder] = (int)local_128;
    iVar10 = index_tree_recursion<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                       (ti,n_00,ld,cm,start_preorder,local_120,start_depth + 1,
                        &this_subtree_max_depth,start_height,height,(int)local_128,
                        is_rightmost_child_00);
    piVar8 = local_120;
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(children_subtree_deletion_costs.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,*local_120 + -1);
    subtree_size_child = iVar10;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&children_postorders,(int *)&children_subtree_deletion_costs);
    if (iVar11 < subtree_size_child) {
      local_134 = *piVar8 + -1;
      local_130 = iVar21;
      iVar11 = subtree_size_child;
    }
    iVar15 = (int)local_100;
    local_100 = local_100 & 0xffffffff;
    if (iVar15 < *height) {
      local_100 = (ulong)(uint)*height;
    }
    (ti->super_PostLToLeftSibling).postl_to_left_sibling_.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(long)*piVar8 + -1] = iVar21;
    std::vector<int,_std::allocator<int>_>::push_back
              (&children_sorted_subtree_size,&subtree_size_child);
    piVar8 = local_120;
    if (n_00 == (n->children_).
                super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
      iVar21 = *local_120 + -1;
      local_108 = iVar21;
    }
    else {
      children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(children_subtree_deletion_costs.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,*local_120 + -1);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&(ti->super_ListKR).list_kr_,(int *)&children_subtree_deletion_costs);
      iVar21 = *piVar8 + -1;
    }
    local_110 = (ulong)(uint)((int)local_110 + iVar10);
    local_e0 = local_e0 + 1;
    n_00 = n_00 + 1;
  }
  iVar21 = (ti->super_Constants).tree_size_;
  iVar11 = *local_120;
  (ti->super_PostLToFavChild).postl_to_fav_child_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start[iVar11] = local_134;
  (ti->super_PostLToFavChild).postl_to_left_fav_child_.super__Vector_base<int,_std::allocator<int>_>
  ._M_impl.super__Vector_impl_data._M_start[*local_120] = local_130;
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  lVar17 = (long)iVar21 + -1;
  lVar16 = lVar17 - iVar11;
  iVar21 = (int)lVar17 - (int)local_128;
  children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (piVar13 = children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start; piVar8 = local_120,
      piVar13 !=
      children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish; piVar13 = piVar13 + 1) {
    if ((int)((ulong)((long)children_subtree_deletion_costs.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)children_subtree_deletion_costs.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) == 0) {
      std::vector<int,_std::allocator<int>_>::push_back(&children_subtree_deletion_costs,piVar13);
    }
    else {
      local_cc = *piVar13 +
                 *(int *)((long)children_subtree_deletion_costs.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start +
                         (((long)children_subtree_deletion_costs.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)children_subtree_deletion_costs.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >>
                         0x1e));
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&children_subtree_deletion_costs,&local_cc);
    }
  }
  std::vector<int,_std::allocator<int>_>::operator=
            ((ti->super_PostLToOrderedChildSize).postl_to_ordered_child_size_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + *local_120,&children_subtree_deletion_costs
            );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>);
  iVar11 = (int)local_100 + 1;
  *height = iVar11;
  (ti->super_PostLToHeight).postl_to_height_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*piVar8] = iVar11;
  iVar11 = (int)local_110 + 1;
  (ti->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*piVar8] = iVar11;
  (ti->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[local_118] = iVar11;
  piVar13 = (ti->super_PostLToParent).postl_to_parent_.super__Vector_base<int,_std::allocator<int>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (piVar12 = children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      piVar12 !=
      children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish; piVar12 = piVar12 + 1) {
    piVar13[*piVar12] = *piVar8;
  }
  iVar10 = (int)local_128;
  (ti->super_PostLToPreL).postl_to_prel_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*piVar8] = iVar10;
  (ti->super_PreLToPostL).prel_to_postl_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[local_118] = *piVar8;
  (ti->super_PreLToPreR).prel_to_prer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[local_118] = (int)lVar16;
  (ti->super_PreRToPreL).prer_to_prel_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar16] = iVar10;
  (ti->super_PreLToPostR).prel_to_postr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[local_118] = iVar21;
  (ti->super_PostRToPreL).postr_to_prel_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[iVar21] = iVar10;
  std::vector<int,_std::allocator<int>_>::operator=
            ((ti->super_PostLToChildren).postl_to_children_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + *piVar8,&children_postorders);
  std::vector<int,_std::allocator<int>_>::operator=
            ((ti->super_PreLToChildren).prel_to_children_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_118,&children_preorders);
  (ti->super_PreLToLabelId).prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[local_118] = iVar9;
  (ti->super_PostLToLabelId).postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start[*piVar8] = iVar9;
  (ti->super_PostLToType).postl_to_type_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*piVar8] = 0;
  this = std::__detail::
         _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&ti->super_InvertedListLabelIdToPostL,&label_id);
  std::vector<int,_std::allocator<int>_>::push_back(this,piVar8);
  (ti->super_PostRToLabelId).postr_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start[iVar21] = label_id;
  (ti->super_PostLToDepth).postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*piVar8] = start_depth;
  this_00 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::at(&(ti->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_,
                 (long)start_depth);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,piVar8);
  lVar16 = local_118;
  pNVar3 = (n->children_).
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar4 = (n->children_).
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar9 = (int)local_100;
  if (pNVar4 == pNVar3) {
    this_subtree_max_depth = start_depth;
    iVar9 = start_height;
  }
  (ti->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[*piVar8] =
       this_subtree_max_depth;
  iVar21 = this_subtree_max_depth;
  if (this_subtree_max_depth < *subtree_max_depth) {
    iVar21 = *subtree_max_depth;
  }
  *subtree_max_depth = iVar21;
  (ti->super_PostLToHeight).postl_to_height_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*piVar8] = iVar9;
  if (iVar9 < *height) {
    iVar9 = *height;
  }
  *height = iVar9;
  (ti->super_PostLToLCh).postl_to_lch_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*piVar8] = local_108;
  if (pNVar4 == pNVar3) {
    (ti->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[*piVar8] = *piVar8;
    piVar13 = (ti->super_PreLToLLD).prel_to_lld_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (int)local_128;
  }
  else {
    piVar13 = (ti->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    piVar13[*piVar8] = piVar13[local_108];
    piVar13 = (ti->super_PreLToLLD).prel_to_lld_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    iVar9 = piVar13[local_118 + 1];
  }
  piVar13[local_118] = iVar9;
  (ti->super_PreLToRLD).prel_to_rld_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[local_118] = (int)local_110 + (int)local_128;
  if ((int)local_e0 != 0) {
    rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&(ti->super_PreLToTypeLeft).prel_to_type_left_,
                        (long)*children_preorders.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
    *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
    rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&(ti->super_PreLToTypeRight).prel_to_type_right_,
                        (long)children_preorders.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[local_e0 + -1]);
    *rVar22._M_p = *rVar22._M_p | rVar22._M_mask;
  }
  lVar18 = (long)iVar11;
  plVar5 = (ti->super_PreLToSpfCost).prel_to_cost_all_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  lVar17 = plVar5[lVar16];
  plVar5[lVar16] = lVar17 + lVar18;
  lVar14 = (long)parent_preorder;
  if (parent_preorder == -1) {
    plVar19 = (ti->super_PreLToSpfCost).prel_to_cost_left_.
              super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar20 = (ti->super_PreLToSpfCost).prel_to_cost_right_.
              super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    plVar5[lVar14] = plVar5[lVar14] + lVar17 + lVar18;
    plVar19 = (ti->super_PreLToSpfCost).prel_to_cost_left_.
              super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar19[lVar14] = plVar19[lVar14] + plVar19[lVar16];
    plVar20 = (ti->super_PreLToSpfCost).prel_to_cost_right_.
              super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar20[lVar14] = plVar20[lVar14] + plVar20[lVar16];
    if ((int)local_128 != parent_preorder + 1) {
      plVar19[lVar14] = plVar19[lVar14] + lVar18;
    }
    if (!is_rightmost_child) {
      plVar20[lVar14] = plVar20[lVar14] + lVar18;
    }
  }
  plVar5[lVar16] = (long)((((int)local_110 + 4) * iVar11) / 2) - plVar5[lVar16];
  plVar19[lVar16] = plVar19[lVar16] + lVar18;
  plVar20[lVar16] = plVar20[lVar16] + lVar18;
  pdVar6 = (ti->super_PreLToSubtreeCost).prel_to_subtree_del_cost_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar6[lVar16] = pdVar6[lVar16] + 1.0;
  pdVar7 = (ti->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar7[lVar16] = pdVar7[lVar16] + 1.0;
  if (parent_preorder != -1) {
    pdVar6[lVar14] = pdVar6[lVar16] + pdVar6[lVar14];
    pdVar7[lVar14] = pdVar7[lVar16] + pdVar7[lVar14];
  }
  *piVar8 = *piVar8 + 1;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&children_preorders.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&children_postorders.super__Vector_base<int,_std::allocator<int>_>);
  return iVar11;
}

Assistant:

int index_tree_recursion(TreeIndex& ti, const node::Node<Label>& n,
    label::LabelDictionary<Label>& ld, const CostModel& cm,
    int& start_preorder, int& start_postorder,
    int start_depth, int& subtree_max_depth,
    int start_height, int& height,
    int parent_preorder, bool is_rightmost_child) {
  
  // Stores number of descendants of this node. Incrementally computed while
  // traversing the children.
  int desc_sum = 0;

  // Stores the current node's label id.
  int label_id = ld.insert(n.label());

  // Stores the current node's type.
  int type = n.label().get_type();

  // Here, start_preorder holds this node's preorder id.
  
  int preorder_r = 0;
  int postorder_r = 0;

  // This node's preorder id.
  int this_nodes_preorder = start_preorder;

  // Increment start_preorder to hold the correct id of the consecutive node
  // in preorder.
  ++start_preorder;
  
  // To store postorder ids of this node's children.
  std::vector<int> children_postorders;
  // To store preorder ids of this node's children.
  std::vector<int> children_preorders;
  // Store the height of all children.
  std::vector<int> children_sorted_subtree_size;

  // InvertedListDepthToPostL index
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    // Add a vector for depth=start_depth in depth inverted list.
    // NOTE: `inverted_list_depth_to_postl_.size()`` returns an `unsigned int`.
    //       If `inverted_list_depth_to_postl_.size = 0`, then
    //       substracting 1 causes incorrect validation of the condition.
    if (static_cast<int>(ti.inverted_list_depth_to_postl_.size()) < (start_depth + 1)) {
      ti.inverted_list_depth_to_postl_.push_back(std::vector<int>());
    }
  }
  
  // This node's subtree max depth.
  int this_subtree_max_depth = 0;
  // This node's height.
  int this_height = 0;

  // To store if the current child in the loop is rightmost.
  bool is_current_child_rightmost = false;

  // Treat the first child separately (non-key-root, updates parent's lld).
  int first_child_postorder = -1;
  // Number of nodes of children subtrees.
  int subtree_size_child = -1;
  // Number of nodes of the child with the largest subtree.
  int largest_subtree_size_child = -1;
  // Postorder number of the favorable child.
  int favorable_child = -1;
  // Postorder number of the left sibling of the favorable child.
  int left_fav_child = -1;
  // Postorder number of the previous child.
  int previous_child_po = -1;
  // Count number of children.
  int num_children = 0;
  // Recursions to childen nodes.
  auto children_start_it = std::begin(n.get_children());
  auto children_end_it = std::end(n.get_children());

  while (children_start_it != children_end_it) {
    // Add the preoder of the current child to children_preorders.
    children_preorders.push_back(start_preorder);

    // Check if this child is rightmost.
    if(std::next(children_start_it) == children_end_it) {
      is_current_child_rightmost = true;
    }

    // PreLToParent index
    if constexpr (std::is_base_of<PreLToParent, TreeIndex>::value) {
      ti.prel_to_parent_[start_preorder] = this_nodes_preorder;
    }
    
    subtree_size_child = index_tree_recursion(ti, *children_start_it, ld, cm,
        start_preorder, start_postorder, start_depth + 1,
        this_subtree_max_depth, start_height, height,
        this_nodes_preorder, is_current_child_rightmost);
    desc_sum += subtree_size_child;
    
    // Add the postorder of the current child to children_postorders.
    children_postorders.push_back(start_postorder-1);
    
    // PostLToFavChild index
    if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
      if (subtree_size_child > largest_subtree_size_child) {
        largest_subtree_size_child = subtree_size_child;
        left_fav_child = previous_child_po;
        favorable_child = start_postorder-1;
      }
    }

    // PostLToHeight index
    if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
      if (height > this_height) {
        this_height = height;
      }
    }

    // PostLToLeftSibling index
    if constexpr (std::is_base_of<PostLToLeftSibling, TreeIndex>::value) {
      ti.postl_to_left_sibling_[start_postorder-1] = previous_child_po;
    }
    
    if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
      children_sorted_subtree_size.push_back(subtree_size_child);
    }

    // Treat the first child separately.
    if (children_start_it == n.get_children().begin()) {
      // Here, start_postorder-1 is the postorder of the current child.
      // Set this node's lld to its first child's lld.
      first_child_postorder = start_postorder-1;
    } else {
      if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
        // Add current child to kr.
        ti.list_kr_.push_back(start_postorder-1);
      }
    }
    
    ++num_children;

    previous_child_po = start_postorder-1;
    
    // Continue to consecutive children.
    ++children_start_it;
  }

  // Here, start_postorder holds this node's postorder id.
  
  // Calculate right-to-left preorder.
  preorder_r = ti.tree_size_ - 1 - start_postorder;
  
  // Calculate right-to-left postorder.
  postorder_r = ti.tree_size_ - 1 - this_nodes_preorder;
  
  // PostLToFavChild index
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_fav_child_[start_postorder] = favorable_child;
    ti.postl_to_left_fav_child_[start_postorder] = left_fav_child;
  }

  // PostLToOrderedChildSize
  if constexpr (std::is_base_of<PostLToOrderedChildSize, TreeIndex>::value) {
    // Sort all children by subtree size.
    std::sort (children_sorted_subtree_size.begin(), children_sorted_subtree_size.end());

    // Removing subtree costs sorted ascending.
    std::vector<int> children_subtree_deletion_costs;
    // Iterate over all children and sum up the costs.
    int current_child = 0;
    for (std::vector<int>::iterator it=children_sorted_subtree_size.begin(); it!=children_sorted_subtree_size.end(); ++it) {
      current_child = children_subtree_deletion_costs.size();
      if (current_child == 0) {
        children_subtree_deletion_costs.push_back(*it);
      } else {
        children_subtree_deletion_costs.push_back(children_subtree_deletion_costs[current_child-1] + *it);
      }
    }
    ti.postl_to_ordered_child_size_[start_postorder] = children_subtree_deletion_costs;
  }

  // PostLToHeight index
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    height = this_height + 1;
    ti.postl_to_height_[start_postorder] = height;
  }

  // PostLToSize index
  if constexpr (std::is_base_of<PostLToSize, TreeIndex>::value) {
    ti.postl_to_size_[start_postorder] = desc_sum + 1;
  }
  
  // PreLToSize index
  if constexpr (std::is_base_of<PreLToSize, TreeIndex>::value) {
    ti.prel_to_size_[this_nodes_preorder] = desc_sum + 1;
  }
  
  // PostLToParent index
  if constexpr (std::is_base_of<PostLToParent, TreeIndex>::value) {
    for (const auto& child_id : children_postorders) {
      ti.postl_to_parent_[child_id] = start_postorder;
    }
  }
  
  // PostLToPreL index
  if constexpr (std::is_base_of<PostLToPreL, TreeIndex>::value) {
    ti.postl_to_prel_[start_postorder] = this_nodes_preorder;
  }
  
  // PreLToPostL index
  if constexpr (std::is_base_of<PreLToPostL, TreeIndex>::value) {
    ti.prel_to_postl_[this_nodes_preorder] = start_postorder;
  }
  
  // PreLToPreR index
  if constexpr (std::is_base_of<PreLToPreR, TreeIndex>::value) {
    ti.prel_to_prer_[this_nodes_preorder] = preorder_r;
  }
  
  // PreRToPreL index
  if constexpr (std::is_base_of<PreRToPreL, TreeIndex>::value) {
    ti.prer_to_prel_[preorder_r] = this_nodes_preorder;
  }
  
  // PreLToPostR index
  if constexpr (std::is_base_of<PreLToPostR, TreeIndex>::value) {
    ti.prel_to_postr_[this_nodes_preorder] = postorder_r;
  }
  
  // PostRToPreL index
  if constexpr (std::is_base_of<PostRToPreL, TreeIndex>::value) {
    ti.postr_to_prel_[postorder_r] = this_nodes_preorder;
  }
  
  // PostLToChildren index
  if constexpr (std::is_base_of<PostLToChildren, TreeIndex>::value) {
    ti.postl_to_children_[start_postorder] = children_postorders;
  }
  
  // PreLToChildren index
  if constexpr (std::is_base_of<PreLToChildren, TreeIndex>::value) {
    ti.prel_to_children_[this_nodes_preorder] = children_preorders;
  }
  
  // PreLToLabelId index
  if constexpr (std::is_base_of<PreLToLabelId, TreeIndex>::value) {
    ti.prel_to_label_id_[this_nodes_preorder] = label_id;
  }
  
  // PostLToLabelId index
  if constexpr (std::is_base_of<PostLToLabelId, TreeIndex>::value) {
    ti.postl_to_label_id_[start_postorder] = label_id;
  }
  
  // PostLToType index
  if constexpr (std::is_base_of<PostLToType, TreeIndex>::value) {
    ti.postl_to_type_[start_postorder] = type;
  }
  
  // InvertedListLabelIdToPostL index
  if constexpr (std::is_base_of<InvertedListLabelIdToPostL, TreeIndex>::value) {
    ti.inverted_list_label_id_to_postl_[label_id].push_back(start_postorder);
  }
  
  // PostRToLabelId index
  if constexpr (std::is_base_of<PostRToLabelId, TreeIndex>::value) {
    ti.postr_to_label_id_[postorder_r] = label_id;
  }
  
  // PostLToDepth index
  if constexpr (std::is_base_of<PostLToDepth, TreeIndex>::value) {
    ti.postl_to_depth_[start_postorder] = start_depth;
  }
  
  // InvertedListDepthToPostL index
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    ti.inverted_list_depth_to_postl_.at(start_depth).push_back(start_postorder);
  }

  // PostLToSubtreeMaxDepth index
  if constexpr (std::is_base_of<PostLToSubtreeMaxDepth, TreeIndex>::value) {
    if (n.is_leaf()) {
      // If this node has no children, set the max depth to this node's depth.
      this_subtree_max_depth = start_depth;
    }
    ti.postl_to_subtree_max_depth_[start_postorder] = this_subtree_max_depth;
    // Update parent subtree's max depth.
    subtree_max_depth = std::max(subtree_max_depth, this_subtree_max_depth);
  }
  
  // PostLToHeight index
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    if (n.is_leaf()) {
      // If this node has no children, set the max depth to this node's depth.
      this_height = start_height;
    }
    ti.postl_to_height_[start_postorder] = this_height;
    // Update parent subtree's max depth.
    height = std::max(height, this_height);
  }
  
  // PostLToLCh index
  if constexpr (std::is_base_of<PostLToLCh, TreeIndex>::value) {
    ti.postl_to_lch_[start_postorder] = first_child_postorder;
  }
  
  // PostLToLLD index
  if constexpr (std::is_base_of<PostLToLLD, TreeIndex>::value) {
    if (n.is_leaf()) {
      // Set lld of this node to this node's postorer.
      ti.postl_to_lld_[start_postorder] = start_postorder;
    } else {
      // This node's lld must be pushed after its childrens llds.
      // lld is indexed starting with 0, thus first_child_postorder-1.
      ti.postl_to_lld_[start_postorder] = ti.postl_to_lld_[first_child_postorder];
    }
  }

  // PreLToLLD index
  if constexpr (std::is_base_of<PreLToLLD, TreeIndex>::value) {
    if (n.is_leaf()) {
      // Set lld of this node to this node's preorder.
      ti.prel_to_lld_[this_nodes_preorder] = this_nodes_preorder;
    } else {
      // Push this node's lld to its first child (this_nodes_preorder + 1).
      ti.prel_to_lld_[this_nodes_preorder] = ti.prel_to_lld_[this_nodes_preorder + 1];
    }
  }

  // PreLToRLD index
  if constexpr (std::is_base_of<PreLToRLD, TreeIndex>::value) {
    // RLD of a node n is: pre(n)+size(n)-1; size(n)=desc_sum+1
    ti.prel_to_rld_[this_nodes_preorder] = this_nodes_preorder + desc_sum;
  }

  // PreLToTypeLeft index
  if constexpr (std::is_base_of<PreLToTypeLeft, TreeIndex>::value) {
    if (num_children > 0) {
      ti.prel_to_type_left_[children_preorders[0]] = true;
    }
  }

  // PreLToTypeRight index
  if constexpr (std::is_base_of<PreLToTypeRight, TreeIndex>::value) {
    if (num_children > 0) {
      ti.prel_to_type_right_[children_preorders[num_children-1]] = true;
    }
  }

  // PreLToSpfCost indexes
  // TODO: Indexes store long long int, but desc_sum is an
  //       int. Verify if there is no weird conversion.
  if constexpr (std::is_base_of<PreLToSpfCost, TreeIndex>::value) {
    // Add this node's subtree size to this node's sum.
    ti.prel_to_cost_all_[this_nodes_preorder] += desc_sum + 1;
    // If this node has a parent.
    if (parent_preorder != -1) {
      // Update the parent with this node's sum.
      ti.prel_to_cost_all_[parent_preorder] += ti.prel_to_cost_all_[this_nodes_preorder];
      ti.prel_to_cost_left_[parent_preorder] += ti.prel_to_cost_left_[this_nodes_preorder];
      ti.prel_to_cost_right_[parent_preorder] += ti.prel_to_cost_right_[this_nodes_preorder];
      // Check if this node is leftmost child of its parent.
      if (this_nodes_preorder != parent_preorder + 1) {
        ti.prel_to_cost_left_[parent_preorder] += desc_sum + 1;
      }
      // Check if this node is rightmost child of its parent.
      if (!is_rightmost_child) {
        ti.prel_to_cost_right_[parent_preorder] += desc_sum + 1;
      }
    }
    // Calculate the cost and store.
    ti.prel_to_cost_all_[this_nodes_preorder] =
        (desc_sum + 1) * (desc_sum + 1 + 3) / 2 - ti.prel_to_cost_all_[this_nodes_preorder];
    // Add this node's subtree size to this node's sum.
    ti.prel_to_cost_left_[this_nodes_preorder] += desc_sum + 1;
    ti.prel_to_cost_right_[this_nodes_preorder] += desc_sum + 1;
  }

  // PreLToSubtreeCost indexes
  if constexpr (std::is_base_of<PreLToSubtreeCost, TreeIndex>::value) {
    // Add the cost of this node's subtree.
    ti.prel_to_subtree_del_cost_[this_nodes_preorder] += cm.del(label_id);
    ti.prel_to_subtree_ins_cost_[this_nodes_preorder] += cm.ins(label_id);
    // If this node has a parent.
    if (parent_preorder != -1) {
      // Update the cost of the parent node subtree.
      ti.prel_to_subtree_del_cost_[parent_preorder] += ti.prel_to_subtree_del_cost_[this_nodes_preorder];
      ti.prel_to_subtree_ins_cost_[parent_preorder] += ti.prel_to_subtree_ins_cost_[this_nodes_preorder];
    }
  }

  // Increment start_postorder for the consecutive node in postorder to have the
  // correct id.
  ++start_postorder;

  // Return the number of nodes in the subtree rooted at this node.
  return desc_sum + 1;
  
}